

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

void __thiscall kratos::StringConst::StringConst(StringConst *this,string *value,uint32_t width)

{
  int64_t value_00;
  VarException *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar1;
  format_args args;
  string_view format_str;
  initializer_list<const_kratos::IRNode_*> __l;
  string local_80;
  StringConst *local_60;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_58;
  allocator_type local_31;
  
  value_00 = convert_string_to_int(value);
  Const::Const(&this->super_Const,value_00,width,false);
  (this->super_Const).super_Var.super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_00578808;
  std::__cxx11::string::string((string *)&this->value_,(string *)value);
  local_58.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(ulong)width;
  if ((pointer)((this->value_)._M_string_length << 3) <=
      local_58.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    return;
  }
  this_00 = (VarException *)__cxa_allocate_exception(0x10);
  local_58.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)(value->_M_dataplus)._M_p;
  local_58.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)value->_M_string_length;
  bVar1 = fmt::v7::to_string_view<char,_0>("{0} is too big for constant with bit size {0}");
  format_str.data_ = (char *)bVar1.size_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_58;
  format_str.size_ = 0x2d;
  fmt::v7::detail::vformat_abi_cxx11_(&local_80,(detail *)bVar1.data_,format_str,args);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_60;
  local_60 = this;
  std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
            (&local_58,__l,&local_31);
  VarException::VarException(this_00,&local_80,&local_58);
  __cxa_throw(this_00,&VarException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

StringConst::StringConst(std::string value, uint32_t width)
    : Const(convert_string_to_int(value), width, false), value_(std::move(value)) {
    auto const min_size = value_.size() * 8u;
    if (min_size > width)
        throw VarException(::format("{0} is too big for constant with bit size {0}", value, width),
                           {this});
}